

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

void __thiscall Client::handleDeleteUserRequest(Client *this,DeleteUserRequest request)

{
  CommunicationStack *pCVar1;
  Event EVar2;
  DeleteUserResponse local_71;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70 [3];
  DatabaseException *e;
  DeleteUserResponse local_29;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  Client *local_18;
  Client *this_local;
  DeleteUserRequest request_local;
  
  local_18 = this;
  this_local._4_4_ = request.id;
  if (this->user == (User *)0x0) {
    pCVar1 = this->communicationStack;
    DeleteUserResponse::DeleteUserResponse(&local_29,false);
    EVar2 = DeleteUserResponse::operator_cast_to_basic_json((DeleteUserResponse *)&local_28);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_28,EVar2.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_28);
  }
  else {
    Database::deleteUser(&server.database,request.id);
    pCVar1 = this->communicationStack;
    DeleteUserResponse::DeleteUserResponse(&local_71,true);
    EVar2 = DeleteUserResponse::operator_cast_to_basic_json((DeleteUserResponse *)local_70);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,local_70,EVar2.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(local_70);
  }
  return;
}

Assistant:

void Client::handleDeleteUserRequest(DeleteUserRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(DeleteUserResponse(false));
		return;
	}

	try
	{
		server.database.deleteUser(request.id);
	}
	catch (DatabaseException& e)
	{
		std::cout << e.what() << std::endl;
		communicationStack->sendEvent(DeleteUserResponse(false));
		return;
	}

	communicationStack->sendEvent(DeleteUserResponse(true));
}